

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O1

char * lstep(re_guts *g,sopno start,sopno stop,char *bef,int ch,char *aft)

{
  sop *psVar1;
  byte bVar2;
  byte bVar3;
  sop sVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  
  if (start != stop) {
    uVar9 = start & 0xffffffff;
    do {
      iVar8 = (int)uVar9;
      psVar1 = g->strip;
      uVar7 = (uint)psVar1[start];
      switch((ulong)(uVar7 & 0x7c000000) - 0x4000000 >> 0x1a) {
      case 1:
        if ((char)psVar1[start] == ch) {
LAB_001096b6:
          bVar3 = bef[iVar8];
          goto LAB_001096bd;
        }
        break;
      case 2:
        if ((ch & 0xfffffffdU) == 0x81) goto LAB_001096b6;
        break;
      case 3:
        if ((ch & 0xfffffffeU) == 0x82) goto LAB_001096b6;
        break;
      case 4:
        if (ch < 0x80) goto LAB_001096b6;
        break;
      case 5:
        if ((ch < 0x80) &&
           (uVar9 = (ulong)((uVar7 & 0x3ffffff) << 5),
           (*(byte *)(*(long *)((long)&g->sets->ptr + uVar9) + (ulong)(ch & 0xff)) &
           (&g->sets->mask)[uVar9]) != 0)) goto LAB_001096b6;
        break;
      case 6:
      case 7:
      case 8:
      case 0xb:
      case 0xc:
      case 0xd:
        bVar3 = aft[iVar8];
LAB_001096bd:
        aft[(long)iVar8 + 1] = aft[(long)iVar8 + 1] | bVar3;
        break;
      case 9:
        lVar5 = (long)iVar8;
        aft[lVar5 + 1] = aft[lVar5 + 1] | aft[lVar5];
        lVar6 = lVar5 - (ulong)(uVar7 & 0x3ffffff);
        bVar3 = aft[lVar6];
        bVar2 = aft[lVar5] | bVar3;
        aft[lVar6] = bVar2;
        if (bVar2 != 0 && bVar3 == 0) {
          start = start + ~(ulong)(uVar7 & 0x3ffffff);
          iVar8 = (int)start;
        }
        break;
      case 10:
      case 0xe:
        bVar3 = aft[iVar8];
        aft[(long)iVar8 + 1] = aft[(long)iVar8 + 1] | bVar3;
        aft[(ulong)(uVar7 & 0x3ffffff) + (long)iVar8] =
             aft[(ulong)(uVar7 & 0x3ffffff) + (long)iVar8] | bVar3;
        break;
      case 0xf:
        if (aft[iVar8] != 0) {
          sVar4 = psVar1[start + 1];
          lVar5 = 1;
          uVar7 = (uint)sVar4;
          while ((uVar7 & 0x7c000000) != 0x48000000) {
            lVar5 = lVar5 + (ulong)((uint)sVar4 & 0x3ffffff);
            sVar4 = psVar1[start + lVar5];
            uVar7 = (uint)sVar4;
          }
          aft[iVar8 + lVar5] = aft[iVar8 + lVar5] | aft[iVar8];
        }
        break;
      case 0x10:
        bVar3 = aft[iVar8];
        aft[(long)iVar8 + 1] = aft[(long)iVar8 + 1] | bVar3;
        if ((*(uint *)(g->strip + start + (ulong)(uVar7 & 0x3ffffff)) & 0x7c000000) != 0x48000000) {
          aft[(long)iVar8 + (ulong)(uVar7 & 0x3ffffff)] =
               aft[(long)iVar8 + (ulong)(uVar7 & 0x3ffffff)] | bVar3;
        }
        break;
      case 0x11:
        aft[(long)iVar8 + 1] = aft[(long)iVar8 + 1] | aft[iVar8];
        break;
      case 0x12:
        if (ch == 0x85) goto LAB_001096b6;
        break;
      case 0x13:
        if (ch == 0x86) goto LAB_001096b6;
      }
      start = start + 1;
      uVar9 = (ulong)(iVar8 + 1);
    } while (start != stop);
  }
  return aft;
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
register struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
register states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
register states aft;		/* states already known reachable after */
{
	register cset *cs;
	register sop s;
	register sopno pc;
	register onestate here;		/* note, macros know this name */
	register sopno look;
	register long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}